

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O2

void __thiscall
glslang::TIntermediate::TIntermediate(TIntermediate *this,EShLanguage l,int v,EProfile p)

{
  _Rb_tree_header *p_Var1;
  uint in_EAX;
  undefined8 uStack_28;
  
  this->language = l;
  (this->entryPointName)._M_dataplus._M_p = (pointer)&(this->entryPointName).field_2;
  (this->entryPointName)._M_string_length = 0;
  (this->entryPointName).field_2._M_local_buf[0] = '\0';
  (this->entryPointMangledName)._M_dataplus._M_p = (pointer)&(this->entryPointMangledName).field_2;
  (this->entryPointMangledName)._M_string_length = 0;
  (this->entryPointMangledName).field_2._M_local_buf[0] = '\0';
  (this->callGraph).super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->callGraph;
  (this->callGraph).super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->callGraph;
  (this->callGraph).super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>._M_impl.
  _M_node._M_size = 0;
  this->profile = p;
  this->version = v;
  (this->spvVersion).spv = 0;
  (this->spvVersion).vulkanGlsl = 0;
  (this->spvVersion).vulkan = 0;
  (this->spvVersion).openGl = 0;
  (this->spvVersion).vulkanRelaxed = false;
  this->treeRoot = (TIntermNode *)0x0;
  (this->requestedExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->requestedExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->requestedExtensions)._M_t._M_impl.super__Rb_tree_header;
  (this->requestedExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->requestedExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->requestedExtensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_28._0_4_ = in_EAX;
  memset(&this->resources,0,0x1a5);
  this->uniqueId = 0;
  this->numEntryPoints = 0;
  this->numErrors = 0;
  this->numPushConstants = 0;
  this->recursive = false;
  this->invertY = false;
  this->dxPositionW = false;
  this->enhancedMsgs = false;
  this->dxPositionW = false;
  this->enhancedMsgs = false;
  this->debugInfo = false;
  this->useStorageBuffer = false;
  this->invariantAll = false;
  this->nanMinMaxClamp = false;
  this->depthReplacing = false;
  this->stencilReplacing = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->globalUniformBlockName,"",(allocator<char> *)((long)&uStack_28 + 3));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->atomicCounterBlockName,"",(allocator<char> *)((long)&uStack_28 + 2));
  this->globalUniformBlockSet = 0x3f;
  this->globalUniformBlockBinding = 0xffff;
  this->atomicCounterBlockSet = 0x3f;
  this->implicitThisName = "@this";
  this->implicitCounterName = "@count";
  this->source = EShSourceNone;
  this->useVulkanMemoryModel = false;
  this->invocations = -1;
  this->vertices = -1;
  this->blendEquations = 0;
  this->xfbMode = false;
  this->inputPrimitive = ElgNone;
  this->outputPrimitive = ElgNone;
  *(undefined4 *)((long)&this->outputPrimitive + 3) = 0;
  this->vertexSpacing = EvsNone;
  this->vertexOrder = EvoNone;
  this->interlockOrdering = EioNone;
  this->pointMode = false;
  this->earlyFragmentTests = false;
  this->postDepthCoverage = false;
  this->earlyAndLateFragmentTestsAMD = false;
  this->earlyAndLateFragmentTestsAMD = false;
  this->nonCoherentColorAttachmentReadEXT = false;
  this->nonCoherentDepthAttachmentReadEXT = false;
  this->nonCoherentStencilAttachmentReadEXT = false;
  this->hlslFunctionality1 = false;
  this->depthLayout = EldNone;
  this->stencilLayout = ElsNone;
  *(undefined8 *)
   ((long)&(this->xfbBuffers).
           super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
           super__Vector_impl_data._M_finish + 3) = 0;
  *(undefined8 *)
   ((long)&(this->xfbBuffers).
           super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 3) = 0;
  (this->xfbBuffers).super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->xfbBuffers).super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->numShaderRecordBlocks = 0;
  this->computeDerivativeMode = LayoutDerivativeNone;
  this->primitives = -1;
  this->numTaskNVBlocks = 0;
  this->layoutPrimitiveCulling = false;
  this->numTaskEXTPayloads = 0;
  std::array<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_6UL>::
  array(&this->shiftBindingForSet);
  (this->semanticNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->semanticNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->semanticNameSet)._M_t._M_impl.super__Rb_tree_header;
  (this->resourceSetBinding).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->resourceSetBinding).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->resourceSetBinding).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 7) = 0;
  *(undefined8 *)
   ((long)&(this->resourceSetBinding).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  (this->semanticNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->semanticNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  this->usePhysicalStorageBuffer = false;
  this->useReplicatedComposites = false;
  p_Var1 = &(this->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header;
  (this->semanticNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->textureSamplerTransformMode = EShTexSampTransKeep;
  this->needToLegalize = false;
  this->binaryDoubleOutput = false;
  this->subgroupUniformControlFlow = false;
  this->maximallyReconverges = false;
  this->spirvRequirement = (TSpirvRequirement *)0x0;
  this->spirvExecutionMode = (TSpirvExecutionMode *)0x0;
  (this->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header;
  (this->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->uniformLocationOverrides)._M_h._M_buckets =
       &(this->uniformLocationOverrides)._M_h._M_single_bucket;
  (this->uniformLocationOverrides)._M_h._M_bucket_count = 1;
  (this->uniformLocationOverrides)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->uniformLocationOverrides)._M_h._M_element_count = 0;
  (this->uniformLocationOverrides)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->numericFeatures).features = 0;
  (this->uniformLocationOverrides)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->uniformLocationOverrides)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->uniformLocationOverrides)._M_h._M_single_bucket + 6) = 0;
  (this->blockBackingOverrides)._M_h._M_buckets =
       &(this->blockBackingOverrides)._M_h._M_single_bucket;
  (this->blockBackingOverrides)._M_h._M_bucket_count = 1;
  (this->blockBackingOverrides)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->blockBackingOverrides)._M_h._M_element_count = 0;
  (this->blockBackingOverrides)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->blockBackingOverrides)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->blockBackingOverrides)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->usedConstantId)._M_h._M_buckets = &(this->usedConstantId)._M_h._M_single_bucket;
  (this->usedConstantId)._M_h._M_bucket_count = 1;
  (this->usedConstantId)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->usedConstantId)._M_h._M_element_count = 0;
  (this->usedConstantId)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ioAccessed)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->ioAccessed)._M_t._M_impl.super__Rb_tree_header;
  (this->ioAccessed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&(this->usedConstantId)._M_h._M_rehash_policy._M_next_resize,0,0x100);
  (this->ioAccessed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ioAccessed)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ioAccessed)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sourceFile)._M_dataplus._M_p = (pointer)&(this->sourceFile).field_2;
  (this->sourceFile)._M_string_length = 0;
  (this->sourceFile).field_2._M_local_buf[0] = '\0';
  (this->sourceText)._M_dataplus._M_p = (pointer)&(this->sourceText).field_2;
  (this->sourceText)._M_string_length = 0;
  (this->sourceText).field_2._M_local_buf[0] = '\0';
  (this->includeText)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->includeText)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->includeText)._M_t._M_impl.super__Rb_tree_header;
  (this->includeText)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->includeText)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->includeText)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->processes).processes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->processes).processes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->processes).processes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->localSize[0] = 1;
  this->localSize[1] = 1;
  this->localSize[2] = 1;
  this->localSizeNotDefault[0] = false;
  this->localSizeNotDefault[1] = false;
  this->localSizeNotDefault[2] = false;
  this->localSizeSpecId[0] = -1;
  this->localSizeSpecId[1] = -1;
  this->localSizeSpecId[2] = -1;
  std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::resize
            (&this->xfbBuffers,0xf);
  uStack_28 = (ulong)(uint)uStack_28;
  std::array<unsigned_int,_6UL>::fill
            (&this->shiftBinding,(value_type_conflict1 *)((long)&uStack_28 + 4));
  return;
}

Assistant:

explicit TIntermediate(EShLanguage l, int v = 0, EProfile p = ENoProfile) :
        language(l),
        profile(p), version(v),
        treeRoot(nullptr),
        resources(TBuiltInResource{}),
        numEntryPoints(0), numErrors(0), numPushConstants(0), recursive(false),
        invertY(false),
        dxPositionW(false),
        enhancedMsgs(false),
        debugInfo(false),
        useStorageBuffer(false),
        invariantAll(false),
        nanMinMaxClamp(false),
        depthReplacing(false),
        stencilReplacing(false),
        uniqueId(0),
        globalUniformBlockName(""),
        atomicCounterBlockName(""),
        globalUniformBlockSet(TQualifier::layoutSetEnd),
        globalUniformBlockBinding(TQualifier::layoutBindingEnd),
        atomicCounterBlockSet(TQualifier::layoutSetEnd),
        implicitThisName("@this"), implicitCounterName("@count"),
        source(EShSourceNone),
        useVulkanMemoryModel(false),
        invocations(TQualifier::layoutNotSet), vertices(TQualifier::layoutNotSet),
        inputPrimitive(ElgNone), outputPrimitive(ElgNone),
        pixelCenterInteger(false), originUpperLeft(false),texCoordBuiltinRedeclared(false),
        vertexSpacing(EvsNone), vertexOrder(EvoNone), interlockOrdering(EioNone), pointMode(false), earlyFragmentTests(false),
        postDepthCoverage(false), earlyAndLateFragmentTestsAMD(false),
        nonCoherentColorAttachmentReadEXT(false),
        nonCoherentDepthAttachmentReadEXT(false),
        nonCoherentStencilAttachmentReadEXT(false),
        depthLayout(EldNone),
        stencilLayout(ElsNone),
        hlslFunctionality1(false),
        blendEquations(0), xfbMode(false), multiStream(false),
        layoutOverrideCoverage(false),
        geoPassthroughEXT(false),
        numShaderRecordBlocks(0),
        computeDerivativeMode(LayoutDerivativeNone),
        primitives(TQualifier::layoutNotSet),
        numTaskNVBlocks(0),
        layoutPrimitiveCulling(false),
        numTaskEXTPayloads(0),
        autoMapBindings(false),
        autoMapLocations(false),
        flattenUniformArrays(false),
        useUnknownFormat(false),
        hlslOffsets(false),
        hlslIoMapping(false),
        useVariablePointers(false),
        textureSamplerTransformMode(EShTexSampTransKeep),
        needToLegalize(false),
        binaryDoubleOutput(false),
        subgroupUniformControlFlow(false),
        maximallyReconverges(false),
        usePhysicalStorageBuffer(false),
        spirvRequirement(nullptr),
        spirvExecutionMode(nullptr),
        uniformLocationBase(0),
        quadDerivMode(false), reqFullQuadsMode(false)
    {
        localSize[0] = 1;
        localSize[1] = 1;
        localSize[2] = 1;
        localSizeNotDefault[0] = false;
        localSizeNotDefault[1] = false;
        localSizeNotDefault[2] = false;
        localSizeSpecId[0] = TQualifier::layoutNotSet;
        localSizeSpecId[1] = TQualifier::layoutNotSet;
        localSizeSpecId[2] = TQualifier::layoutNotSet;
        xfbBuffers.resize(TQualifier::layoutXfbBufferEnd);
        shiftBinding.fill(0);
    }